

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_fail_example.cpp
# Opt level: O0

void foo4(int *a)

{
  ostream *poVar1;
  runtime_error *this;
  undefined1 local_28 [8];
  saver_exit<int_&> state_saver;
  int *a_local;
  
  state_saver.super_state_saver<int_&,_nstd::detail::on_exit_policy>._16_8_ = a;
  nstd::saver_exit<int_&>::state_saver((saver_exit<int_&> *)local_28,a);
  *(undefined4 *)state_saver.super_state_saver<int_&,_nstd::detail::on_exit_policy>._16_8_ = 4;
  poVar1 = std::operator<<((ostream *)&std::cout,"foo4 a = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,*(int *)state_saver.
                                     super_state_saver<int_&,_nstd::detail::on_exit_policy>._16_8_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  nstd::detail::state_saver<int_&,_nstd::detail::on_exit_policy>::dismiss
            ((state_saver<int_&,_nstd::detail::on_exit_policy> *)local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"foo4 state_saver::dismiss");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void foo4(int& a) {
  MAKE_SAVER_EXIT(state_saver, a); // Custom state saver on fail.

  a = 4;
  std::cout << "foo4 a = " << a << std::endl;

  state_saver.dismiss(); // Dismiss, state will not automatically restored.
  std::cout << "foo4 state_saver::dismiss" << std::endl;
  throw std::runtime_error{"error"};
  // Original state will not automatically restored, on error.
}